

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRF02.h
# Opt level: O0

int GetRangeSRF02(SRF02 *pSRF02,int device,double *pValue)

{
  int iVar1;
  int recvbuflen;
  int sendbuflen;
  uchar recvbuf [32];
  uchar sendbuf [32];
  double *pValue_local;
  int device_local;
  SRF02 *pSRF02_local;
  
  if ((device < 0) || (0xf < device)) {
    printf("Error reading data from a SRF02 : Invalid parameter. \n");
    pSRF02_local._4_4_ = 3;
  }
  else {
    iVar1 = SetSlaveComputerI2CBus
                      (pSRF02->I2CBus,pSRF02->addr[device],0,0,pSRF02->nbretries,pSRF02->timeout);
    if (iVar1 == 0) {
      memset(recvbuf + 0x18,0,0x20);
      recvbuf[0x18] = '\0';
      recvbuf[0x19] = 'Q';
      iVar1 = WriteAllComputerI2CBus(pSRF02->I2CBus,recvbuf + 0x18,2);
      if (iVar1 == 0) {
        if ((pSRF02->bSaveRawData != 0) && (pSRF02->pfSaveFile != (FILE *)0x0)) {
          fwrite(recvbuf + 0x18,2,1,(FILE *)pSRF02->pfSaveFile);
          fflush((FILE *)pSRF02->pfSaveFile);
        }
        mSleep((long)pSRF02->RangingDelay);
        memset(recvbuf + 0x18,0,0x20);
        recvbuf[0x18] = '\0';
        iVar1 = WriteAllComputerI2CBus(pSRF02->I2CBus,recvbuf + 0x18,1);
        if (iVar1 == 0) {
          if ((pSRF02->bSaveRawData != 0) && (pSRF02->pfSaveFile != (FILE *)0x0)) {
            fwrite(recvbuf + 0x18,1,1,(FILE *)pSRF02->pfSaveFile);
            fflush((FILE *)pSRF02->pfSaveFile);
          }
          memset(&recvbuflen,0,0x20);
          iVar1 = ReadAllComputerI2CBus(pSRF02->I2CBus,(uint8 *)&recvbuflen,6);
          if (iVar1 == 0) {
            if ((pSRF02->bSaveRawData != 0) && (pSRF02->pfSaveFile != (FILE *)0x0)) {
              fwrite(&recvbuflen,6,1,(FILE *)pSRF02->pfSaveFile);
              fflush((FILE *)pSRF02->pfSaveFile);
            }
            *pValue = (double)((uint)recvbuflen._3_1_ + (uint)recvbuflen._2_1_ * 0x100) / 100.0;
            pSRF02->LastRanges[device] = *pValue;
            pSRF02_local._4_4_ = 0;
          }
          else {
            pSRF02_local._4_4_ = 1;
          }
        }
        else {
          pSRF02_local._4_4_ = 1;
        }
      }
      else {
        pSRF02_local._4_4_ = 1;
      }
    }
    else {
      pSRF02_local._4_4_ = 1;
    }
  }
  return pSRF02_local._4_4_;
}

Assistant:

inline int GetRangeSRF02(SRF02* pSRF02, int device, double* pValue)
{
	unsigned char sendbuf[MAX_NB_BYTES_SRF02];
	unsigned char recvbuf[MAX_NB_BYTES_SRF02];
	int sendbuflen = 0;
	int recvbuflen = 0;

	if ((device < 0)||(device >= MAX_NB_DEVICES_SRF02))
	{
		printf("Error reading data from a SRF02 : Invalid parameter. \n");
		return EXIT_INVALID_PARAMETER;
	}

	if (SetSlaveComputerI2CBus(pSRF02->I2CBus, pSRF02->addr[device], 0, 0, pSRF02->nbretries, pSRF02->timeout) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	// Prepare data to send to device.
	memset(sendbuf, 0, sizeof(sendbuf));
	sendbuf[0] = (unsigned char)COMMAND_REG_SRF02;
	sendbuf[1] = (unsigned char)REAL_RNG_CM_CMD_SRF02;
	sendbuflen = 2;

	if (WriteAllComputerI2CBus(pSRF02->I2CBus, (unsigned char*)sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if ((pSRF02->bSaveRawData)&&(pSRF02->pfSaveFile))
	{
		fwrite(sendbuf, sendbuflen, 1, pSRF02->pfSaveFile);
		fflush(pSRF02->pfSaveFile);
	}

	mSleep(pSRF02->RangingDelay);

	// Prepare data to send to device.
	memset(sendbuf, 0, sizeof(sendbuf));
	sendbuf[0] = (unsigned char)COMMAND_REG_SRF02;
	sendbuflen = 1;

	if (WriteAllComputerI2CBus(pSRF02->I2CBus, (unsigned char*)sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if ((pSRF02->bSaveRawData)&&(pSRF02->pfSaveFile))
	{
		fwrite(sendbuf, sendbuflen, 1, pSRF02->pfSaveFile);
		fflush(pSRF02->pfSaveFile);
	}

	// Prepare the buffer that should receive data from device.
	memset(recvbuf, 0, sizeof(recvbuf));
	recvbuflen = 6;

	if (ReadAllComputerI2CBus(pSRF02->I2CBus, (unsigned char*)recvbuf, recvbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if ((pSRF02->bSaveRawData)&&(pSRF02->pfSaveFile))
	{
		fwrite(recvbuf, recvbuflen, 1, pSRF02->pfSaveFile);
		fflush(pSRF02->pfSaveFile);
	}

	// Display and analyze received data.
	//printf("Received : \"%s\"\n", recvbuf);
	*pValue = (recvbuf[3] + 256*recvbuf[2])/100.0; // Convert in m.

	pSRF02->LastRanges[device] = *pValue;

	return EXIT_SUCCESS;
}